

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_parameterization_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::PointCloudParameterizationQuantity::createProgram
          (PointCloudParameterizationQuantity *this)

{
  PointCloud *pPVar1;
  element_type *peVar2;
  ShaderProgram *program;
  Engine *pEVar3;
  string *this_00;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  allocator_type local_1b6;
  allocator local_1b5;
  allocator local_1b4;
  allocator local_1b3;
  allocator_type local_1b2;
  allocator_type local_1b1;
  __shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  string local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  pEVar3 = render::engine;
  switch((this->vizStyle).value) {
  case CHECKER:
    std::__cxx11::string::string(local_188,"RAYCAST_SPHERE",&local_1b3);
    pPVar1 = (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent;
    std::__cxx11::string::string((string *)&local_168,"SPHERE_PROPAGATE_VALUE2",&local_1b4);
    std::__cxx11::string::string(local_148,"SHADE_CHECKER_VALUE2",&local_1b5);
    __l._M_len = 2;
    __l._M_array = &local_168;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a0,__l,&local_1b6);
    PointCloud::addStructureRules(&local_1a0,pPVar1,&local_a0);
    (*pEVar3->_vptr_Engine[0x23])(&local_1b0,pEVar3,local_188,&local_1a0,0);
    std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->program).
                super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
               &local_1b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
    lVar4 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&local_168._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    goto LAB_001bde96;
  case GRID:
    std::__cxx11::string::string(local_188,"RAYCAST_SPHERE",&local_1b3);
    pPVar1 = (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent;
    std::__cxx11::string::string((string *)&local_168,"SPHERE_PROPAGATE_VALUE2",&local_1b4);
    std::__cxx11::string::string(local_148,"SHADE_GRID_VALUE2",&local_1b5);
    __l_02._M_len = 2;
    __l_02._M_array = &local_168;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b8,__l_02,&local_1b6);
    PointCloud::addStructureRules(&local_1a0,pPVar1,&local_b8);
    (*pEVar3->_vptr_Engine[0x23])(&local_1b0,pEVar3,local_188,&local_1a0,0);
    std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->program).
                super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
               &local_1b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    lVar4 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&local_168._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
LAB_001bde96:
    this_00 = local_188;
    break;
  case LOCAL_CHECK:
    std::__cxx11::string::string(local_188,"RAYCAST_SPHERE",&local_1b3);
    pPVar1 = (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent;
    std::__cxx11::string::string((string *)&local_168,"SPHERE_PROPAGATE_VALUE2",&local_1b4);
    std::__cxx11::string::string(local_148,"SHADE_COLORMAP_ANGULAR2",&local_1b5);
    std::__cxx11::string::string(local_128,"CHECKER_VALUE2COLOR",(allocator *)&local_1b6);
    __l_00._M_len = 3;
    __l_00._M_array = &local_168;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_d0,__l_00,&local_1b2);
    PointCloud::addStructureRules(&local_1a0,pPVar1,&local_d0);
    (*pEVar3->_vptr_Engine[0x23])(&local_1b0,pEVar3,local_188,&local_1a0,0);
    std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->program).
                super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
               &local_1b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0);
    lVar4 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_168._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    std::__cxx11::string::~string(local_188);
    peVar2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_48,"t_colormap",(allocator *)&local_168);
    (*peVar2->_vptr_ShaderProgram[0x19])(peVar2,local_48,&(this->cMap).value,0);
    this_00 = local_48;
    break;
  case LOCAL_RAD:
    std::__cxx11::string::string(local_188,"RAYCAST_SPHERE",&local_1b3);
    pPVar1 = (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent;
    std::__cxx11::string::string((string *)&local_168,"SPHERE_PROPAGATE_VALUE2",&local_1b4);
    std::__cxx11::string::string(local_148,"SHADE_COLORMAP_ANGULAR2",&local_1b5);
    std::__cxx11::string::string(local_128,"SHADEVALUE_MAG_VALUE2",(allocator *)&local_1b6);
    std::__cxx11::string::string(local_108,"ISOLINE_STRIPE_VALUECOLOR",(allocator *)&local_1b2);
    __l_01._M_len = 4;
    __l_01._M_array = &local_168;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_e8,__l_01,&local_1b1);
    PointCloud::addStructureRules(&local_1a0,pPVar1,&local_e8);
    (*pEVar3->_vptr_Engine[0x23])(&local_1b0,pEVar3,local_188,&local_1a0,0);
    std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->program).
                super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
               &local_1b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    lVar4 = 0x60;
    do {
      std::__cxx11::string::~string((string *)((long)&local_168._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    std::__cxx11::string::~string(local_188);
    peVar2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_68,"t_colormap",(allocator *)&local_168);
    (*peVar2->_vptr_ShaderProgram[0x19])(peVar2,local_68,&(this->cMap).value,0);
    this_00 = local_68;
    break;
  default:
    goto switchD_001bd9ed_default;
  }
  std::__cxx11::string::~string(this_00);
switchD_001bd9ed_default:
  PointCloud::fillGeometryBuffers
            ((this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent,
             (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  peVar2 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_88,"a_value2",(allocator *)&local_168);
  (*peVar2->_vptr_ShaderProgram[0xf])(peVar2,local_88,&this->coords,0,0,0xffffffffffffffff);
  std::__cxx11::string::~string(local_88);
  pEVar3 = render::engine;
  program = (this->program).
            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  PointCloud::getMaterial_abi_cxx11_
            (&local_168,
             (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent);
  render::Engine::setMaterial(pEVar3,program,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  return;
}

Assistant:

void PointCloudParameterizationQuantity::createProgram() {
  // Create the program to draw this quantity

  switch (getStyle()) {
  case ParamVizStyle::CHECKER:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_CHECKER_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader(
        "RAYCAST_SPHERE", parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_CHECKER_VALUE2"}));
    break;
  case ParamVizStyle::GRID:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_GRID_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader("RAYCAST_SPHERE",
                                            parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_GRID_VALUE2"}));
    break;
  case ParamVizStyle::LOCAL_CHECK:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_LOCAL_CHECKER_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader(
        "RAYCAST_SPHERE",
        parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_COLORMAP_ANGULAR2", "CHECKER_VALUE2COLOR"}));
    program->setTextureFromColormap("t_colormap", cMap.get());
    break;
  case ParamVizStyle::LOCAL_RAD:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_LOCAL_RAD_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader(
        "RAYCAST_SPHERE", parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_COLORMAP_ANGULAR2",
                                                    "SHADEVALUE_MAG_VALUE2", "ISOLINE_STRIPE_VALUECOLOR"}));
    program->setTextureFromColormap("t_colormap", cMap.get());
    break;
  }

  // Fill buffers
  parent.fillGeometryBuffers(*program);
  program->setAttribute("a_value2", coords);

  render::engine->setMaterial(*program, parent.getMaterial());
}